

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O0

void avro::ensureType<std::vector<avro::json::Entity,std::allocator<avro::json::Entity>>>
               (Entity *e,string *name)

{
  EntityType EVar1;
  EntityType EVar2;
  undefined8 uVar3;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  Entity *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  format *in_stack_fffffffffffffee8;
  Exception *in_stack_fffffffffffffef0;
  char *in_stack_ffffffffffffff18;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  Entity *in_stack_ffffffffffffff88;
  
  EVar1 = json::Entity::type(in_RDI);
  EVar2 = json::type_traits<std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_>::
          type();
  if (EVar1 != EVar2) {
    uVar3 = __cxa_allocate_exception(0x18);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    json::type_traits<std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_>::name()
    ;
    this = boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                     (in_stack_fffffffffffffeb0,(char **)in_stack_fffffffffffffea8);
    json::Entity::toString_abi_cxx11_(in_stack_ffffffffffffff88);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
              (this,in_stack_fffffffffffffea8);
    Exception::Exception(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

void ensureType(const Entity& e, const string& name)
{
    if (e.type() != json::type_traits<T>::type()) {
        throw Exception(boost::format("Json field \"%1%\" is not a %2%: %3%") %
            name % json::type_traits<T>::name() % e.toString());
    }
}